

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

int __thiscall UnifiedRegex::CharBitvec::NextClear(CharBitvec *this,int k)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint32 uVar5;
  int iVar6;
  
  if ((uint)k < 0x100) {
    uVar2 = k & 0x1f;
    uVar3 = (ulong)((uint)k >> 5);
    uVar4 = this->vec[uVar3] >> (sbyte)uVar2;
    iVar6 = 0;
    do {
      if (uVar4 == 0xffffffff) {
        iVar1 = (k - uVar2) + 0x20;
        goto LAB_00cd6d92;
      }
      if ((uVar4 & 1) == 0) {
LAB_00cd6dc2:
        return k - iVar6;
      }
      uVar4 = uVar4 >> 1;
      iVar6 = iVar6 + -1;
    } while (uVar2 - 0x20 != iVar6);
    iVar1 = k - iVar6;
LAB_00cd6d92:
    k = iVar1;
    if (uVar3 < 7) {
      uVar5 = this->vec[uVar3 + 1];
      uVar3 = uVar3 + 1;
      iVar6 = 0;
      do {
        iVar1 = k + 0x20;
        if (uVar5 == 0xffffffff) break;
        if ((uVar5 & 1) == 0) goto LAB_00cd6dc2;
        uVar5 = uVar5 >> 1;
        iVar6 = iVar6 + -1;
      } while (iVar6 != -0x20);
      goto LAB_00cd6d92;
    }
  }
  return -1;
}

Assistant:

int CharBitvec::NextClear(int k) const
    {
        if (k < 0 || k >= Size)
            return -1;
        uint w = k / wordSize;
        uint o = k % wordSize;
        uint32 v = vec[w] >> o;
        do
        {
            if (v == ones)
            {
                k += wordSize - o;
                break;
            }
            else if ((v & 0x1) == 0)
                return k;
            else
            {
                v >>= 1;
                o++;
                k++;
            }
        }
        while (o < wordSize);

        w++;
        while (w < vecSize)
        {
            o = 0;
            v = vec[w];
            do
            {
                if (v == ones)
                {
                    k += wordSize - o;
                    break;
                }
                else if ((v & 0x1) == 0)
                    return k;
                else
                {
                    v >>= 1;
                    o++;
                    k++;
                }

            }
            while (o < wordSize);
            w++;
        }
        return -1;
    }